

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O1

void * TPZFront<float>::STensorProductMTData::Execute(void *data)

{
  long *plVar1;
  
  if (data == (void *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFront.h"
               ,0xfd);
  }
  plVar1 = *(long **)(*(long *)((long)data + 8) + 0x100);
  if (plVar1 == (long *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFront.h"
               ,0xff);
  }
  (**(code **)(*plVar1 + 0x60))(plVar1,*data,*(undefined8 *)((long)data + 8));
  return (void *)0x0;
}

Assistant:

static void *Execute(void *data){
			STensorProductThreadData * mypair = static_cast< STensorProductThreadData * >(data);
			if(!mypair) DebugStop();
			TPZFront<TVar> * mat = mypair->second->fMat;
			if(!mat) DebugStop();
			mat->TensorProductIJ(mypair->first,mypair->second);
			return NULL;
		}